

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O3

void __thiscall JsUtil::BackgroundJobProcessor::IndicateNewJob(BackgroundJobProcessor *this)

{
  ParallelThreadData *pPVar1;
  ThreadService *pTVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  
  bVar4 = CCLock::IsLocked(&(this->criticalSection).super_CCLock);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x327,"(criticalSection.IsLocked())","criticalSection.IsLocked()");
    if (!bVar4) goto LAB_0067c277;
    *puVar6 = 0;
  }
  uVar5 = NumberOfThreadsWaitingForJobs(this);
  if (uVar5 != 0) {
    if (this->threadService->threadService == (ThreadServiceCallback)0x0) {
      SetEvent((this->jobReady).handle);
      return;
    }
    if (this->threadCount != 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                         ,0x32d,"(this->threadCount == 1)","this->threadCount == 1");
      if (!bVar4) {
LAB_0067c277:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pPVar1 = *this->parallelThreadData;
    pPVar1->isWaitingForJobs = false;
    ResetEvent((pPVar1->threadStartedOrClosing).handle);
    pTVar2 = this->threadService;
    pTVar2->isInCallback = true;
    bVar4 = (*pTVar2->threadService)(ThreadServiceCallback,this);
    pTVar2->isInCallback = false;
    if (!bVar4) {
      (*this->parallelThreadData)->isWaitingForJobs = true;
    }
  }
  return;
}

Assistant:

void BackgroundJobProcessor::IndicateNewJob()
    {
        Assert(criticalSection.IsLocked());

        if(NumberOfThreadsWaitingForJobs ())
        {
            if (threadService->HasCallback())
            {
                Assert(this->threadCount == 1);
                this->parallelThreadData[0]->isWaitingForJobs = false;

                // Reset the thread event, so we can wait for it on shutdown.
                this->parallelThreadData[0]->threadStartedOrClosing.Reset();

                // Submit a request to the thread service.
                bool success = threadService->Invoke(ThreadServiceCallback, this);
                if (!success)
                {
                    // The thread service denied our request.
                    // Leave the job in the queue.  If it's needed, it will be processed
                    // in-thread during PrioritizeJob.  Or alternatively, if a subsequent
                    // thread service request succeeds, this job will be processed then.
                    this->parallelThreadData[0]->isWaitingForJobs = true;
                }
            }
            else
            {
                // Signal the background thread to wake up and process jobs.
                jobReady.Set();
            }
        }
    }